

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STL_set.cpp
# Opt level: O1

void FindPeople(void)

{
  _Rb_tree_color _Var1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char cVar6;
  istream *piVar7;
  _Rb_tree_node_base *p_Var8;
  _Link_type __x;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  char *pcVar11;
  _Rb_tree_node_base *p_Var12;
  int iVar13;
  bool bVar14;
  bool bVar15;
  int age;
  int w;
  int h;
  int m;
  int n;
  set<people,_std::less<people>,_std::allocator<people>_> s;
  undefined1 local_74 [16];
  int local_64 [3];
  _Rb_tree_node_base local_58;
  long local_38;
  
  piVar7 = (istream *)std::istream::operator>>((istream *)&std::cin,local_64);
  __x = (_Link_type)(local_74 + 0xc);
  std::istream::operator>>(piVar7,(int *)__x);
  local_58._M_left = &local_58;
  local_58._M_color = _S_red;
  local_58._M_parent = (_Rb_tree_node_base *)0x0;
  local_38 = 0;
  local_58._M_right = local_58._M_left;
  if (0 < local_64[0]) {
    iVar13 = 0;
    do {
      p_Var9 = &local_58;
      piVar7 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)(local_74 + 8));
      piVar7 = (istream *)std::istream::operator>>(piVar7,(int *)(local_74 + 4));
      __x = (_Link_type)local_74;
      std::istream::operator>>(piVar7,(int *)__x);
      uVar5 = local_74._8_4_;
      uVar4 = local_74._4_4_;
      uVar3 = local_74._0_4_;
      p_Var10 = local_58._M_parent;
      if (local_58._M_parent == (_Rb_tree_node_base *)0x0) {
        bVar14 = true;
      }
      else {
        do {
          p_Var9 = p_Var10;
          _Var1 = p_Var9[1]._M_color;
          bVar15 = SBORROW4(local_74._8_4_,_Var1);
          bVar14 = (int)(local_74._8_4_ - _Var1) < 0;
          if (local_74._8_4_ == _Var1) {
            iVar2 = *(int *)&p_Var9[1].field_0x4;
            bVar15 = SBORROW4(local_74._4_4_,iVar2);
            bVar14 = local_74._4_4_ - iVar2 < 0;
            if (local_74._4_4_ == iVar2) {
              bVar15 = SBORROW4(local_74._0_4_,*(int *)&p_Var9[1]._M_parent);
              bVar14 = local_74._0_4_ - *(int *)&p_Var9[1]._M_parent < 0;
            }
          }
          bVar14 = bVar15 != bVar14;
          p_Var10 = (&p_Var9->_M_left)[!bVar14];
        } while (p_Var10 != (_Base_ptr)0x0);
      }
      p_Var8 = p_Var9;
      if (bVar14) {
        if (p_Var9 != local_58._M_left) {
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var9);
          goto LAB_0010181e;
        }
      }
      else {
LAB_0010181e:
        _Var1 = p_Var8[1]._M_color;
        bVar15 = SBORROW4(_Var1,uVar5);
        bVar14 = (int)(_Var1 - uVar5) < 0;
        if (_Var1 == uVar5) {
          iVar2 = *(int *)&p_Var8[1].field_0x4;
          bVar15 = SBORROW4(iVar2,uVar4);
          bVar14 = iVar2 - uVar4 < 0;
          if (iVar2 == uVar4) {
            bVar15 = SBORROW4(*(int *)&p_Var8[1]._M_parent,uVar3);
            bVar14 = *(int *)&p_Var8[1]._M_parent - uVar3 < 0;
          }
        }
        if (bVar15 == bVar14) {
          p_Var9 = (_Rb_tree_node_base *)0x0;
          p_Var10 = p_Var8;
        }
      }
      if (p_Var9 != (_Rb_tree_node_base *)0x0) {
        if (p_Var10 == (_Rb_tree_node_base *)0x0) {
          bVar14 = true;
          if (&local_58 != p_Var9) {
            _Var1 = p_Var9[1]._M_color;
            bVar15 = SBORROW4(uVar5,_Var1);
            bVar14 = (int)(uVar5 - _Var1) < 0;
            if (uVar5 == _Var1) {
              iVar2 = *(int *)&p_Var9[1].field_0x4;
              bVar15 = SBORROW4(uVar4,iVar2);
              bVar14 = uVar4 - iVar2 < 0;
              if (uVar4 == iVar2) {
                bVar15 = SBORROW4(uVar3,*(int *)&p_Var9[1]._M_parent);
                bVar14 = uVar3 - *(int *)&p_Var9[1]._M_parent < 0;
              }
            }
            bVar14 = bVar15 != bVar14;
          }
        }
        else {
          bVar14 = true;
        }
        __x = (_Link_type)operator_new(0x30);
        *(undefined4 *)(__x->_M_storage)._M_storage = uVar5;
        *(undefined4 *)((__x->_M_storage)._M_storage + 4) = uVar4;
        *(undefined4 *)((__x->_M_storage)._M_storage + 8) = uVar3;
        std::_Rb_tree_insert_and_rebalance(bVar14,(_Rb_tree_node_base *)__x,p_Var9,&local_58);
        local_38 = local_38 + 1;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < local_64[0]);
  }
  p_Var9 = &local_58;
  if (0 < (int)local_74._12_4_) {
    iVar13 = 0;
    do {
      piVar7 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)(local_74 + 8));
      piVar7 = (istream *)std::istream::operator>>(piVar7,(int *)(local_74 + 4));
      std::istream::operator>>(piVar7,(int *)local_74);
      p_Var8 = p_Var9;
      for (p_Var10 = local_58._M_parent; p_Var10 != (_Rb_tree_node_base *)0x0;
          p_Var10 = (&p_Var10->_M_left)[bVar15 != bVar14]) {
        _Var1 = p_Var10[1]._M_color;
        bVar15 = SBORROW4(_Var1,local_74._8_4_);
        bVar14 = (int)(_Var1 - local_74._8_4_) < 0;
        if (_Var1 == local_74._8_4_) {
          iVar2 = *(int *)&p_Var10[1].field_0x4;
          bVar15 = SBORROW4(iVar2,local_74._4_4_);
          bVar14 = iVar2 - local_74._4_4_ < 0;
          if (iVar2 == local_74._4_4_) {
            bVar15 = SBORROW4(*(int *)&p_Var10[1]._M_parent,local_74._0_4_);
            bVar14 = *(int *)&p_Var10[1]._M_parent - local_74._0_4_ < 0;
          }
        }
        if (bVar15 == bVar14) {
          p_Var8 = p_Var10;
        }
      }
      p_Var12 = p_Var9;
      if (p_Var8 != p_Var9) {
        _Var1 = p_Var8[1]._M_color;
        bVar15 = SBORROW4(local_74._8_4_,_Var1);
        bVar14 = (int)(local_74._8_4_ - _Var1) < 0;
        if (local_74._8_4_ == _Var1) {
          iVar2 = *(int *)&p_Var8[1].field_0x4;
          bVar15 = SBORROW4(local_74._4_4_,iVar2);
          bVar14 = local_74._4_4_ - iVar2 < 0;
          if (local_74._4_4_ == iVar2) {
            bVar15 = SBORROW4(local_74._0_4_,*(int *)&p_Var8[1]._M_parent);
            bVar14 = local_74._0_4_ - *(int *)&p_Var8[1]._M_parent < 0;
          }
        }
        p_Var12 = p_Var8;
        if (bVar15 != bVar14) {
          p_Var12 = p_Var9;
        }
      }
      pcVar11 = "YES";
      if (p_Var12 == p_Var9) {
        pcVar11 = "NO";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar11,(ulong)(p_Var12 == p_Var9) ^ 3);
      cVar6 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      __x = (_Link_type)(ulong)(uint)(int)cVar6;
      std::ostream::put(-0x70);
      std::ostream::flush();
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)local_74._12_4_);
  }
  std::_Rb_tree<people,_people,_std::_Identity<people>,_std::less<people>,_std::allocator<people>_>
  ::_M_erase((_Rb_tree<people,_people,_std::_Identity<people>,_std::less<people>,_std::allocator<people>_>
              *)local_58._M_parent,__x);
  return;
}

Assistant:

void FindPeople() {
    struct people{
        int h;
        int w;
        int age;
        //自定义构造函数，来代替people.h 等的输入，直接调用people(h,w,age)传入h,w,age
        people(int _h,int _w, int _age)
        {
            h = _h;
            w = _w;
            age = _age;
        }
        //重载 "<"
        bool operator <(const people &rhs) const
        {
            if (h != rhs.h)
                return h < rhs.h;
            if (w != rhs.w)
                return w < rhs.w;
            return age < rhs.age;
        }
    };
    int n,m,h,w,age;
    cin >> n >> m;
    set<people> s;
    for (int i = 0; i < n; ++i) {
        cin >> h >> w >> age;
        s.insert(people(h,w,age));
    }
    for (int j = 0; j < m; ++j) {
        cin >> h >> w >> age;
        if(s.count(people(h,w,age)))
            cout << "YES" << endl;
        else
            cout << "NO" << endl;
    }
}